

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_cond.cpp
# Opt level: O0

void __thiscall SharedCond::~SharedCond(SharedCond *this)

{
  __pid_t _Var1;
  int iVar2;
  pointer this_00;
  pthread_cond_t *__cond;
  ContextManager *pCVar3;
  string local_30;
  SharedCond *local_10;
  SharedCond *this_local;
  
  local_10 = this;
  _Var1 = getpid();
  if (_Var1 == this->owner_pid_) {
    this_00 = std::
              unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
              ::operator->(&this->cond_);
    __cond = (pthread_cond_t *)SharedMemoryObject<pthread_cond_t>::get(this_00);
    iVar2 = pthread_cond_destroy(__cond);
    if (iVar2 != 0) {
      pCVar3 = ContextManager::get();
      format_abi_cxx11_(&local_30,"Failed to destroy cond: %m");
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  std::
  unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  ::~unique_ptr(&this->cond_);
  return;
}

Assistant:

SharedCond::~SharedCond() {
    if (getpid() == owner_pid_) {
        if (pthread_cond_destroy(cond_->get()) != 0) {
            die(format("Failed to destroy cond: %m"));
        }
    }
}